

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractTypeRefining.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_22::AbstractTypeRefining::run(AbstractTypeRefining *this,Module *module)

{
  Module *wasm;
  bool bVar1;
  PassOptions *pPVar2;
  reference __in;
  type *this_00;
  reference pHVar3;
  reference pHVar4;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *this_01;
  reference pHVar5;
  size_type sVar6;
  pair<std::__detail::_Node_iterator<wasm::HeapType,_true,_true>,_bool> pVar7;
  key_type local_448;
  HeapType subType;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range3_1;
  HeapType type_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2_2;
  SubTypes subTypes;
  value_type local_388;
  HeapType type_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2_1;
  value_type local_340;
  HeapType type;
  iterator __end3;
  iterator __begin3;
  type *__range3;
  type *types;
  type *_;
  _Self local_308;
  iterator __end2;
  iterator __begin2;
  Map *__range2;
  Func local_2e8;
  undefined1 local_2c8 [8];
  ParallelFunctionAnalysis<std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  analysis;
  Fatal local_1a0;
  Module *local_18;
  Module *module_local;
  AbstractTypeRefining *this_local;
  
  local_18 = module;
  module_local = (Module *)this;
  bVar1 = FeatureSet::hasGC(&module->features);
  if (bVar1) {
    pPVar2 = Pass::getPassOptions(&this->super_Pass);
    if ((pPVar2->closedWorld & 1U) == 0) {
      Fatal::Fatal(&local_1a0);
      Fatal::operator<<(&local_1a0,(char (*) [45])"AbstractTypeRefining requires --closed-world");
      Fatal::~Fatal(&local_1a0);
    }
    pPVar2 = Pass::getPassOptions(&this->super_Pass);
    this->trapsNeverHappen = (bool)(pPVar2->trapsNeverHappen & 1);
    NewFinder::NewFinder((NewFinder *)&analysis.field_0x30,&this->createdTypes);
    Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    ::walkModuleCode((Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                      *)&analysis.field_0x30,local_18);
    NewFinder::~NewFinder((NewFinder *)&analysis.field_0x30);
    wasm = local_18;
    std::
    function<void(wasm::Function*,std::unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>&)>
    ::
    function<wasm::(anonymous_namespace)::AbstractTypeRefining::run(wasm::Module*)::_lambda(wasm::Function*,std::unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>&)_1_,void>
              ((function<void(wasm::Function*,std::unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>&)>
                *)&local_2e8,(anon_class_1_0_00000001 *)((long)&__range2 + 7));
    wasm::ModuleUtils::
    ParallelFunctionAnalysis<std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
    ::ParallelFunctionAnalysis
              ((ParallelFunctionAnalysis<std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                *)local_2c8,wasm,&local_2e8);
    std::
    function<void_(wasm::Function_*,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_&)>
    ::~function((function<void_(wasm::Function_*,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_&)>
                 *)&local_2e8);
    __end2 = std::
             map<wasm::Function_*,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>_>
             ::begin((map<wasm::Function_*,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>_>
                      *)&analysis);
    local_308._M_node =
         (_Base_ptr)
         std::
         map<wasm::Function_*,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>_>
         ::end((map<wasm::Function_*,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>_>
                *)&analysis);
    while (bVar1 = std::operator!=(&__end2,&local_308), bVar1) {
      __in = std::
             _Rb_tree_iterator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>
             ::operator*(&__end2);
      std::
      get<0ul,wasm::Function*const,std::unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>>
                (__in);
      this_00 = std::
                get<1ul,wasm::Function*const,std::unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>>
                          (__in);
      __end3 = std::
               unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
               ::begin(this_00);
      type.id = (uintptr_t)
                std::
                unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                ::end(this_00);
      while (bVar1 = std::__detail::operator!=
                               (&__end3.super__Node_iterator_base<wasm::HeapType,_true>,
                                (_Node_iterator_base<wasm::HeapType,_true> *)&type), bVar1) {
        pHVar3 = std::__detail::_Node_iterator<wasm::HeapType,_true,_true>::operator*(&__end3);
        local_340.id = pHVar3->id;
        std::
        unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
        ::insert(&this->createdTypes,&local_340);
        std::__detail::_Node_iterator<wasm::HeapType,_true,_true>::operator++(&__end3);
      }
      std::
      _Rb_tree_iterator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>
      ::operator++(&__end2);
    }
    wasm::ModuleUtils::getPublicHeapTypes
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__begin2_1,local_18);
    __end2_1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                         ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__begin2_1);
    type_1.id = (uintptr_t)
                std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                          ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__begin2_1);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                               *)&type_1), bVar1) {
      pHVar4 = __gnu_cxx::
               __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
               ::operator*(&__end2_1);
      local_388.id = pHVar4->id;
      pVar7 = std::
              unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
              ::insert(&this->createdTypes,&local_388);
      subTypes.typeSubTypes._M_h._M_single_bucket =
           (__node_base_ptr)pVar7.first.super__Node_iterator_base<wasm::HeapType,_true>._M_cur;
      __gnu_cxx::
      __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
      ::operator++(&__end2_1);
    }
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__begin2_1);
    SubTypes::SubTypes((SubTypes *)&__range2_2,local_18);
    std::
    unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
    ::operator=(&this->createdTypesOrSubTypes,&this->createdTypes);
    SubTypes::getSubTypesFirstSort
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__begin2_2,
               (SubTypes *)&__range2_2);
    __end2_2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                         ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__begin2_2);
    type_2.id = (uintptr_t)
                std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                          ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__begin2_2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                               *)&type_2), bVar1) {
      pHVar4 = __gnu_cxx::
               __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
               ::operator*(&__end2_2);
      __range3_1 = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)pHVar4->id;
      this_01 = SubTypes::getImmediateSubTypes((SubTypes *)&__range2_2,(HeapType)__range3_1);
      __end3_1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(this_01);
      subType.id = (uintptr_t)
                   std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(this_01);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                 *)&subType), bVar1) {
        pHVar5 = __gnu_cxx::
                 __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                 ::operator*(&__end3_1);
        local_448.id = pHVar5->id;
        sVar6 = std::
                unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                ::count(&this->createdTypesOrSubTypes,&local_448);
        if (sVar6 != 0) {
          std::
          unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
          ::insert(&this->createdTypesOrSubTypes,(value_type *)&__range3_1);
          break;
        }
        __gnu_cxx::
        __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
        ::operator++(&__end3_1);
      }
      __gnu_cxx::
      __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
      ::operator++(&__end2_2);
    }
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__begin2_2);
    if ((this->trapsNeverHappen & 1U) != 0) {
      computeAbstractTypes(this,(SubTypes *)&__range2_2);
    }
    optimize(this,local_18,(SubTypes *)&__range2_2);
    SubTypes::~SubTypes((SubTypes *)&__range2_2);
    wasm::ModuleUtils::
    ParallelFunctionAnalysis<std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
    ::~ParallelFunctionAnalysis
              ((ParallelFunctionAnalysis<std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                *)local_2c8);
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    if (!getPassOptions().closedWorld) {
      Fatal() << "AbstractTypeRefining requires --closed-world";
    }

    trapsNeverHappen = getPassOptions().trapsNeverHappen;

    // First, find all the created types (that have a struct.new) both in module
    // code and in functions.
    NewFinder(createdTypes).walkModuleCode(module);

    ModuleUtils::ParallelFunctionAnalysis<Types> analysis(
      *module, [&](Function* func, Types& types) {
        if (!func->imported()) {
          NewFinder(types).walk(func->body);
        }
      });

    for (auto& [_, types] : analysis.map) {
      for (auto type : types) {
        createdTypes.insert(type);
      }
    }

    // Assume all public types are created, which makes them non-abstract and
    // hence ignored below.
    // TODO: In principle we could assume such types are not created outside the
    //       module, given closed world, but we'd also need to make sure that
    //       we don't need to make any changes to public types that refer to
    //       them.
    for (auto type : ModuleUtils::getPublicHeapTypes(*module)) {
      createdTypes.insert(type);
    }

    SubTypes subTypes(*module);

    // Compute createdTypesOrSubTypes by starting with the created types and
    // then propagating subtypes.
    createdTypesOrSubTypes = createdTypes;
    for (auto type : subTypes.getSubTypesFirstSort()) {
      // If any of our subtypes are created, so are we.
      for (auto subType : subTypes.getImmediateSubTypes(type)) {
        if (createdTypesOrSubTypes.count(subType)) {
          createdTypesOrSubTypes.insert(type);
          break;
        }
      }
    }

    if (trapsNeverHappen) {
      computeAbstractTypes(subTypes);
    }

    // Use what we found about abstract types and never-created types to
    // optimize.
    optimize(module, subTypes);
  }